

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_7,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  float scalar;
  undefined4 uVar6;
  Vector<float,_3> res;
  Type in0;
  float afStack_98 [6];
  Vec4 *local_80;
  float local_78 [5];
  float local_64 [3];
  Matrix<float,_4,_2> local_58;
  Vec4 *local_30;
  float local_28;
  float local_1c [2];
  float local_14;
  
  pfVar1 = (float *)&local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 == 0x10);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_58.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_58.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_58.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    local_58.m_data.m_data[1].m_data[0] = 0.0;
    local_58.m_data.m_data[1].m_data[1] = 0.0;
    local_58.m_data.m_data[1].m_data[2] = 0.0;
    local_58.m_data.m_data[1].m_data[3] = 0.0;
    local_58.m_data.m_data[0].m_data[0] = 0.0;
    local_58.m_data.m_data[0].m_data[1] = 0.0;
    local_58.m_data.m_data[0].m_data[2] = 0.0;
    local_58.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &s_constInMat2x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 == 4);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 2;
    } while (lVar2 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  tcu::operator*((Matrix<float,_4,_2> *)&local_30,&local_58,scalar);
  local_80 = local_30;
  local_78[0] = local_28;
  local_64[0] = local_1c[0];
  local_64[1] = local_1c[1];
  local_64[2] = local_14;
  afStack_98[2] = 0.0;
  afStack_98[3] = 0.0;
  afStack_98[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_98[lVar2 + 2] = *(float *)((long)&local_80 + lVar2 * 4) + local_64[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_80 = &evalCtx->color;
  local_78[0] = 0.0;
  local_78[1] = 1.4013e-45;
  local_78[2] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_80 + lVar2 * 4)] = afStack_98[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}